

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_CallCommon<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>_>
          *playout,RecyclableObject *function,uint flags,AuxArray<unsigned_int> *spreadIndices)

{
  ushort uVar1;
  uint uVar2;
  code *pcVar3;
  ImplicitCallFlags flags_00;
  bool bVar4;
  ThreadContext *this_00;
  undefined4 *puVar5;
  JavascriptMethod p_Var6;
  Var pvVar7;
  Arguments local_d0;
  Arguments local_c0;
  CallInfo local_b0;
  undefined1 local_a8 [8];
  Arguments args_1;
  Arguments local_88 [2];
  CallInfo local_68;
  undefined1 local_60 [8];
  Arguments args;
  AutoReentrancySafeRegion autoReentrancySafeRegion;
  ArgSlot argCount;
  ImplicitCallFlags savedImplicitCallFlags;
  ThreadContext *threadContext;
  AuxArray<unsigned_int> *spreadIndices_local;
  uint flags_local;
  RecyclableObject *function_local;
  OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>_>
  *playout_local;
  InterpreterStackFrame *this_local;
  
  this_00 = ScriptContext::GetThreadContext(*(ScriptContext **)(this + 0x78));
  flags_00 = ThreadContext::GetImplicitCallFlags(this_00);
  bVar4 = IsInDebugMode(this);
  if (bVar4) {
    JavascriptFunction::CheckValidDebugThunk(*(ScriptContext **)(this + 0x78),function);
  }
  uVar1 = (playout->super_OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).
          super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.
          super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.ArgCount;
  AutoReentrancySafeRegion::AutoReentrancySafeRegion
            ((AutoReentrancySafeRegion *)&args.Values,this_00);
  if ((playout->super_OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).
      super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.
      super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.Return == 0xffffffff) {
    spreadIndices_local._4_4_ = flags | CallFlags_NotUsed;
    CallInfo::CallInfo(&local_68,spreadIndices_local._4_4_,(uint)uVar1);
    Arguments::Arguments((Arguments *)local_60,local_68,*(Var **)(this + 0x28));
    if ((local_60._3_4_ &
        (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed|
         CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New)) !=
        spreadIndices_local._4_4_) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0xf7d,"(static_cast<unsigned>(args.Info.Flags) == flags)",
                                  "Flags don\'t fit into the CallInfo field?");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    autoReentrancySafeRegion._12_2_ = Arguments::GetArgCountWithExtraArgs((Arguments *)local_60);
    if (spreadIndices == (AuxArray<unsigned_int> *)0x0) {
      p_Var6 = RecyclableObject::GetEntryPoint(function);
      Arguments::Arguments((Arguments *)&args_1.Values,(Arguments *)local_60);
      JavascriptFunction::CallFunction<true>(function,p_Var6,(Arguments *)&args_1.Values,false);
    }
    else {
      Arguments::Arguments(local_88,(Arguments *)local_60);
      JavascriptFunction::CallSpreadFunction(function,local_88,spreadIndices);
    }
  }
  else {
    spreadIndices_local._4_4_ = flags | CallFlags_Value;
    CallInfo::CallInfo(&local_b0,spreadIndices_local._4_4_,(uint)uVar1);
    Arguments::Arguments((Arguments *)local_a8,local_b0,*(Var **)(this + 0x28));
    if ((local_a8._3_4_ &
        (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed|
         CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New)) !=
        spreadIndices_local._4_4_) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0xf8c,"(static_cast<unsigned>(args.Info.Flags) == flags)",
                                  "Flags don\'t fit into the CallInfo field?");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    autoReentrancySafeRegion._12_2_ = Arguments::GetArgCountWithExtraArgs((Arguments *)local_a8);
    if (spreadIndices == (AuxArray<unsigned_int> *)0x0) {
      uVar2 = (playout->super_OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
              ).super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.
              super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.Return;
      p_Var6 = RecyclableObject::GetEntryPoint(function);
      Arguments::Arguments(&local_d0,(Arguments *)local_a8);
      pvVar7 = JavascriptFunction::CallFunction<true>(function,p_Var6,&local_d0,false);
      SetReg<unsigned_int>(this,uVar2,pvVar7);
    }
    else {
      uVar2 = (playout->super_OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
              ).super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.
              super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.Return;
      Arguments::Arguments(&local_c0,(Arguments *)local_a8);
      pvVar7 = JavascriptFunction::CallSpreadFunction(function,&local_c0,spreadIndices);
      SetReg<unsigned_int>(this,uVar2,pvVar7);
    }
  }
  AutoReentrancySafeRegion::~AutoReentrancySafeRegion((AutoReentrancySafeRegion *)&args.Values);
  ThreadContext::SetImplicitCallFlags(this_00,flags_00);
  PopOut(this,autoReentrancySafeRegion._12_2_);
  return;
}

Assistant:

void InterpreterStackFrame::OP_CallCommon(const unaligned T * playout, RecyclableObject * function, unsigned flags, const Js::AuxArray<uint32> *spreadIndices)
    {
        // Always save and restore implicit call flags when calling out
        // REVIEW: Can we avoid it if we don't collect dynamic profile info?
        ThreadContext * threadContext = scriptContext->GetThreadContext();
        Js::ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();

#ifdef ENABLE_SCRIPT_DEBUGGING
#if DBG
        if (this->IsInDebugMode())
        {
            JavascriptFunction::CheckValidDebugThunk(scriptContext, function);
        }
#endif
#endif
        ArgSlot argCount = playout->ArgCount;
        BEGIN_SAFE_REENTRANT_REGION(threadContext)
        {
            if (playout->Return == Js::Constants::NoRegister)
            {
                flags |= CallFlags_NotUsed;
                Arguments args(CallInfo((CallFlags)flags, argCount), m_outParams);
                AssertMsg(static_cast<unsigned>(args.Info.Flags) == flags, "Flags don't fit into the CallInfo field?");
                argCount = args.GetArgCountWithExtraArgs();
                if (spreadIndices != nullptr)
                {
                    JavascriptFunction::CallSpreadFunction(function, args, spreadIndices);
                }
                else
                {
                    JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), args);
                }
            }
            else
            {
                flags |= CallFlags_Value;
                Arguments args(CallInfo((CallFlags)flags, argCount), m_outParams);
                AssertMsg(static_cast<unsigned>(args.Info.Flags) == flags, "Flags don't fit into the CallInfo field?");
                argCount = args.GetArgCountWithExtraArgs();
                if (spreadIndices != nullptr)
                {
                    SetReg((RegSlot)playout->Return, JavascriptFunction::CallSpreadFunction(function, args, spreadIndices));
                }
                else
                {
                    SetReg((RegSlot)playout->Return, JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), args));
                }
            }
        }
        END_SAFE_REENTRANT_REGION

            threadContext->SetImplicitCallFlags(savedImplicitCallFlags);
        PopOut(argCount);
    }